

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O0

xmlNodePtr xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt,xmlNodePtr cur)

{
  xmlNsPtr *ppxVar1;
  int iVar2;
  xmlNodePtr cur_local;
  xmlXPathParserContextPtr ctxt_local;
  
  if ((ctxt == (xmlXPathParserContextPtr)0x0) || (ctxt->context == (xmlXPathContextPtr)0x0)) {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  else if (ctxt->context->node->type == XML_ELEMENT_NODE) {
    if (cur == (xmlNodePtr)0x0) {
      if (ctxt->context->tmpNsList != (xmlNsPtr *)0x0) {
        (*xmlFree)(ctxt->context->tmpNsList);
      }
      ctxt->context->tmpNsNr = 0;
      iVar2 = xmlGetNsListSafe(ctxt->context->doc,ctxt->context->node,&ctxt->context->tmpNsList);
      if (iVar2 < 0) {
        xmlXPathPErrMemory(ctxt);
        ctxt_local = (xmlXPathParserContextPtr)0x0;
      }
      else {
        if (ctxt->context->tmpNsList != (xmlNsPtr *)0x0) {
          while (ctxt->context->tmpNsList[ctxt->context->tmpNsNr] != (xmlNsPtr)0x0) {
            ctxt->context->tmpNsNr = ctxt->context->tmpNsNr + 1;
          }
        }
        ctxt_local = (xmlXPathParserContextPtr)&xmlXPathXMLNamespaceStruct;
      }
    }
    else if (ctxt->context->tmpNsNr < 1) {
      if (ctxt->context->tmpNsList != (xmlNsPtr *)0x0) {
        (*xmlFree)(ctxt->context->tmpNsList);
      }
      ctxt->context->tmpNsList = (xmlNsPtr *)0x0;
      ctxt_local = (xmlXPathParserContextPtr)0x0;
    }
    else {
      ppxVar1 = ctxt->context->tmpNsList;
      iVar2 = ctxt->context->tmpNsNr + -1;
      ctxt->context->tmpNsNr = iVar2;
      ctxt_local = (xmlXPathParserContextPtr)ppxVar1[iVar2];
    }
  }
  else {
    ctxt_local = (xmlXPathParserContextPtr)0x0;
  }
  return (xmlNodePtr)ctxt_local;
}

Assistant:

xmlNodePtr
xmlXPathNextNamespace(xmlXPathParserContextPtr ctxt, xmlNodePtr cur) {
    if ((ctxt == NULL) || (ctxt->context == NULL)) return(NULL);
    if (ctxt->context->node->type != XML_ELEMENT_NODE) return(NULL);
    if (cur == NULL) {
        if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsNr = 0;
        if (xmlGetNsListSafe(ctxt->context->doc, ctxt->context->node,
                             &ctxt->context->tmpNsList) < 0) {
            xmlXPathPErrMemory(ctxt);
            return(NULL);
        }
        if (ctxt->context->tmpNsList != NULL) {
            while (ctxt->context->tmpNsList[ctxt->context->tmpNsNr] != NULL) {
                ctxt->context->tmpNsNr++;
            }
        }
	return((xmlNodePtr) xmlXPathXMLNamespace);
    }
    if (ctxt->context->tmpNsNr > 0) {
	return (xmlNodePtr)ctxt->context->tmpNsList[--ctxt->context->tmpNsNr];
    } else {
	if (ctxt->context->tmpNsList != NULL)
	    xmlFree(ctxt->context->tmpNsList);
	ctxt->context->tmpNsList = NULL;
	return(NULL);
    }
}